

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O0

cio_error read_some_max(cio_io_stream *ios,cio_read_buffer *buffer,
                       cio_io_stream_read_handler_t handler,void *context)

{
  size_t sVar1;
  size_t local_40;
  size_t len;
  memory_stream *memory_stream;
  void *context_local;
  cio_io_stream_read_handler_t handler_local;
  cio_read_buffer *buffer_local;
  cio_io_stream *ios_local;
  
  sVar1 = cio_read_buffer_size(buffer);
  if (sVar1 < (ulong)((long)ios[1].close - (long)ios[1].write_some)) {
    local_40 = cio_read_buffer_size(buffer);
  }
  else {
    local_40 = (long)ios[1].close - (long)ios[1].write_some;
  }
  memcpy(buffer->data,ios[1].write_some + (long)ios[1].read_some,local_40);
  ios[1].write_some = ios[1].write_some + local_40;
  buffer->add_ptr = buffer->add_ptr + local_40;
  (*handler)(ios,context,CIO_SUCCESS,buffer);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error read_some_max(struct cio_io_stream *ios, struct cio_read_buffer *buffer, cio_io_stream_read_handler_t handler, void *context)
{
	struct memory_stream *memory_stream = cio_container_of(ios, struct memory_stream, ios);
	size_t len = CIO_MIN(cio_read_buffer_size(buffer), memory_stream->size - memory_stream->read_pos);
	memcpy(buffer->data, &((uint8_t *)memory_stream->mem)[memory_stream->read_pos], len);
	memory_stream->read_pos += len;
	buffer->add_ptr += len;
	handler(ios, context, CIO_SUCCESS, buffer);
	return CIO_SUCCESS;
}